

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O0

void Saig_RefManFindReason_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Int_t *vPrios,Vec_Int_t *vReasons)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Aig_Obj_t *pAVar5;
  int iPrio1;
  int iPrio0;
  int fPhase1;
  int fPhase0;
  Vec_Int_t *vReasons_local;
  Vec_Int_t *vPrios_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Aig_ObjSetTravIdCurrent(p,pObj);
    iVar1 = Aig_ObjIsCi(pObj);
    if (iVar1 == 0) {
      iVar1 = Aig_ObjIsNode(pObj);
      if (iVar1 == 0) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSat.c"
                      ,0x82,
                      "void Saig_RefManFindReason_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      if ((*(ulong *)&pObj->field_0x18 >> 3 & 1) == 0) {
        uVar2 = Aig_ObjFaninC0(pObj);
        pAVar5 = Aig_ObjFanin0(pObj);
        uVar2 = uVar2 ^ (uint)(*(ulong *)&pAVar5->field_0x18 >> 3) & 1;
        uVar3 = Aig_ObjFaninC1(pObj);
        pAVar5 = Aig_ObjFanin1(pObj);
        uVar3 = uVar3 ^ (uint)(*(ulong *)&pAVar5->field_0x18 >> 3) & 1;
        if ((uVar2 != 0) && (uVar3 != 0)) {
          __assert_fail("!fPhase0 || !fPhase1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSat.c"
                        ,0x8c,
                        "void Saig_RefManFindReason_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        if ((uVar2 == 0) && (uVar3 != 0)) {
          pAVar5 = Aig_ObjFanin0(pObj);
          Saig_RefManFindReason_rec(p,pAVar5,vPrios,vReasons);
        }
        else if ((uVar2 == 0) || (uVar3 != 0)) {
          iVar1 = Aig_ObjFaninId0(pObj);
          iVar1 = Vec_IntEntry(vPrios,iVar1);
          iVar4 = Aig_ObjFaninId1(pObj);
          iVar4 = Vec_IntEntry(vPrios,iVar4);
          if (iVar4 < iVar1) {
            pAVar5 = Aig_ObjFanin1(pObj);
            Saig_RefManFindReason_rec(p,pAVar5,vPrios,vReasons);
          }
          else {
            pAVar5 = Aig_ObjFanin0(pObj);
            Saig_RefManFindReason_rec(p,pAVar5,vPrios,vReasons);
          }
        }
        else {
          pAVar5 = Aig_ObjFanin1(pObj);
          Saig_RefManFindReason_rec(p,pAVar5,vPrios,vReasons);
        }
      }
      else {
        pAVar5 = Aig_ObjFanin0(pObj);
        Saig_RefManFindReason_rec(p,pAVar5,vPrios,vReasons);
        pAVar5 = Aig_ObjFanin1(pObj);
        Saig_RefManFindReason_rec(p,pAVar5,vPrios,vReasons);
      }
    }
    else {
      iVar1 = Aig_ObjCioId(pObj);
      Vec_IntPush(vReasons,iVar1);
    }
  }
  return;
}

Assistant:

void Saig_RefManFindReason_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Int_t * vPrios, Vec_Int_t * vReasons )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Aig_ObjIsCi(pObj) )
    {
        Vec_IntPush( vReasons, Aig_ObjCioId(pObj) );
        return;
    }
    assert( Aig_ObjIsNode(pObj) );
    if ( pObj->fPhase )
    {
        Saig_RefManFindReason_rec( p, Aig_ObjFanin0(pObj), vPrios, vReasons );
        Saig_RefManFindReason_rec( p, Aig_ObjFanin1(pObj), vPrios, vReasons );
    }
    else
    {
        int fPhase0 = Aig_ObjFaninC0(pObj) ^ Aig_ObjFanin0(pObj)->fPhase;
        int fPhase1 = Aig_ObjFaninC1(pObj) ^ Aig_ObjFanin1(pObj)->fPhase;
        assert( !fPhase0 || !fPhase1 );
        if ( !fPhase0 && fPhase1 )
            Saig_RefManFindReason_rec( p, Aig_ObjFanin0(pObj), vPrios, vReasons );
        else if ( fPhase0 && !fPhase1 )
            Saig_RefManFindReason_rec( p, Aig_ObjFanin1(pObj), vPrios, vReasons );
        else 
        {
            int iPrio0 = Vec_IntEntry( vPrios, Aig_ObjFaninId0(pObj) );
            int iPrio1 = Vec_IntEntry( vPrios, Aig_ObjFaninId1(pObj) );
            if ( iPrio0 <= iPrio1 )
                Saig_RefManFindReason_rec( p, Aig_ObjFanin0(pObj), vPrios, vReasons );
            else
                Saig_RefManFindReason_rec( p, Aig_ObjFanin1(pObj), vPrios, vReasons );
        }
    }
}